

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.c
# Opt level: O0

ktx_error_code_e ktxTexture_IterateLevelFaces(ktxTexture *This,PFNKTXITERCB iterCb,void *userdata)

{
  byte bVar1;
  undefined8 in_RDX;
  code *in_RSI;
  long in_RDI;
  ktx_size_t offset;
  GLsizei depth;
  GLsizei height;
  GLsizei width;
  ktx_uint32_t innerIterations;
  ktx_uint32_t face;
  ktx_uint32_t faceLodSize;
  ktx_error_code_e result;
  ktx_uint32_t miplevel;
  uint local_54;
  uint local_50;
  uint local_4c;
  long local_48;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  undefined4 local_2c;
  ktx_error_code_e local_28;
  uint local_24;
  undefined8 local_20;
  code *local_18;
  long local_10;
  ktx_error_code_e local_4;
  
  local_28 = KTX_SUCCESS;
  if (in_RDI == 0) {
    local_4 = KTX_INVALID_VALUE;
  }
  else if (in_RSI == (code *)0x0) {
    local_4 = KTX_INVALID_VALUE;
  }
  else {
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    for (local_24 = 0; local_24 < *(uint *)(local_10 + 0x34); local_24 = local_24 + 1) {
      bVar1 = (byte)local_24;
      if (*(uint *)(local_10 + 0x24) >> (bVar1 & 0x1f) == 0) {
        local_4c = 1;
      }
      else {
        local_4c = *(uint *)(local_10 + 0x24) >> (bVar1 & 0x1f);
      }
      local_38 = local_4c;
      if (*(uint *)(local_10 + 0x28) >> (bVar1 & 0x1f) == 0) {
        local_50 = 1;
      }
      else {
        local_50 = *(uint *)(local_10 + 0x28) >> (bVar1 & 0x1f);
      }
      local_3c = local_50;
      if (*(uint *)(local_10 + 0x2c) >> (bVar1 & 0x1f) == 0) {
        local_54 = 1;
      }
      else {
        local_54 = *(uint *)(local_10 + 0x2c) >> (bVar1 & 0x1f);
      }
      local_40 = local_54;
      local_2c = (**(code **)(*(long *)(local_10 + 0x18) + 8))(local_10,local_24);
      if (((*(byte *)(local_10 + 0x21) & 1) == 0) || ((*(byte *)(local_10 + 0x20) & 1) != 0)) {
        local_34 = 1;
      }
      else {
        local_34 = *(uint *)(local_10 + 0x3c);
      }
      for (local_30 = 0; local_30 < local_34; local_30 = local_30 + 1) {
        (**(code **)(*(long *)(local_10 + 8) + 8))(local_10,local_24,0,local_30,&local_48);
        local_28 = (*local_18)(local_24,local_30,local_38,local_3c,local_40,local_2c,
                               *(long *)(local_10 + 0x70) + local_48,local_20);
        if (local_28 != KTX_SUCCESS) break;
      }
    }
    local_4 = local_28;
  }
  return local_4;
}

Assistant:

KTX_error_code
ktxTexture_IterateLevelFaces(ktxTexture* This, PFNKTXITERCB iterCb,
                             void* userdata)
{
    ktx_uint32_t    miplevel;
    KTX_error_code  result = KTX_SUCCESS;

    if (This == NULL)
        return KTX_INVALID_VALUE;

    if (iterCb == NULL)
        return KTX_INVALID_VALUE;

    for (miplevel = 0; miplevel < This->numLevels; ++miplevel)
    {
        ktx_uint32_t faceLodSize;
        ktx_uint32_t face;
        ktx_uint32_t innerIterations;
        GLsizei      width, height, depth;

        /* Array textures have the same number of layers at each mip level. */
        width = MAX(1, This->baseWidth  >> miplevel);
        height = MAX(1, This->baseHeight >> miplevel);
        depth = MAX(1, This->baseDepth  >> miplevel);

        faceLodSize = (ktx_uint32_t)ktxTexture_calcFaceLodSize(
                                                    This, miplevel);

        /* All array layers are passed in a group because that is how
         * GL & Vulkan need them. Hence no
         *    for (layer = 0; layer < This->numLayers)
         */
        if (This->isCubemap && !This->isArray)
            innerIterations = This->numFaces;
        else
            innerIterations = 1;
        for (face = 0; face < innerIterations; ++face)
        {
            /* And all z_slices are also passed as a group hence no
             *    for (slice = 0; slice < This->depth)
             */
            ktx_size_t offset;

            ktxTexture_GetImageOffset(This, miplevel, 0, face, &offset);
            result = iterCb(miplevel, face,
                            width, height, depth,
                            faceLodSize, This->pData + offset, userdata);

            if (result != KTX_SUCCESS)
                break;
        }
    }

    return result;
}